

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *left,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  cpp_dec_float<100U,_int,_void> local_88;
  double local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  ::soplex::infinity::__tls_init();
  local_38 = *(double *)(in_FS_OFFSET + -8);
  uStack_30 = 0;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,-local_38);
  if (((*(int *)(this + 0x48) == 2) || (local_88.fpclass == cpp_dec_float_NaN)) ||
     (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        ((cpp_dec_float<100U,_int,_void> *)this,&local_88), iVar8 < 1)) {
    ::soplex::infinity::__tls_init();
    local_88.fpclass = cpp_dec_float_finite;
    local_88.prec_elem = 0x10;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    local_88.data._M_elems[2] = 0;
    local_88.data._M_elems[3] = 0;
    local_88.data._M_elems[4] = 0;
    local_88.data._M_elems[5] = 0;
    local_88.data._M_elems[6] = 0;
    local_88.data._M_elems[7] = 0;
    local_88.data._M_elems[8] = 0;
    local_88.data._M_elems[9] = 0;
    local_88.data._M_elems[10] = 0;
    local_88.data._M_elems[0xb] = 0;
    local_88.data._M_elems[0xc] = 0;
    local_88.data._M_elems[0xd] = 0;
    local_88.data._M_elems._56_5_ = 0;
    local_88.data._M_elems[0xf]._1_3_ = 0;
    local_88.exp = 0;
    local_88.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_88,local_38);
    if ((((left->m_backend).fpclass == cpp_dec_float_NaN) || (local_88.fpclass == cpp_dec_float_NaN)
        ) || (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&left->m_backend,&local_88), this = (soplex *)left, -1 < iVar8)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_88.data._M_elems._0_8_ = local_88.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"XMPSWR01 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_88.data._M_elems._0_8_,
                 local_88.data._M_elems._0_8_ + local_88.data._M_elems._8_8_);
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
  }
  uVar1 = *(undefined8 *)this;
  uVar2 = *(undefined8 *)(this + 8);
  uVar3 = *(undefined8 *)(this + 0x10);
  uVar4 = *(undefined8 *)(this + 0x18);
  uVar5 = *(undefined8 *)(this + 0x20);
  uVar6 = *(undefined8 *)(this + 0x28);
  uVar7 = *(undefined8 *)(this + 0x38);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
       *(undefined8 *)(this + 0x30);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar7;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar5;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) = uVar6;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar3;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar1;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar2;
  (__return_storage_ptr__->m_backend).exp = *(int *)(this + 0x40);
  (__return_storage_ptr__->m_backend).neg = (bool)this[0x44];
  (__return_storage_ptr__->m_backend).fpclass = *(fpclass_type *)(this + 0x48);
  (__return_storage_ptr__->m_backend).prec_elem = *(int32_t *)(this + 0x4c);
  return __return_storage_ptr__;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}